

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wapiti_wrap.cxx
# Opt level: O3

mdl_t * get_params_obj_var(int argc,char **argv)

{
  opt_t *opt;
  rdr_t *rdr;
  mdl_t *mdl;
  FILE *file;
  
  opt = get_default_opt();
  opt_parse(argc,argv,opt);
  rdr = rdr_new(opt->maxent);
  mdl = mdl_new(rdr);
  mdl->opt = opt;
  if (opt->model == (char *)0x0) {
    fatal("you must specify a model");
  }
  info("[Wapiti] Loading model: \"%s\"\n");
  file = fopen(mdl->opt->model,"r");
  if (file == (FILE *)0x0) {
    pfatal("cannot open input model file: %s",mdl->opt->model);
  }
  mdl_load(mdl,(FILE *)file);
  return mdl;
}

Assistant:

mdl_t* get_params_obj_var(int argc, char** argv) {
            opt_t *opt = get_default_opt();

            opt_parse(argc, argv, opt);
            mdl_t *mdl = mdl_new(rdr_new(opt->maxent));
            mdl->opt = opt;
            if (mdl->opt->model == NULL)
                fatal("you must specify a model");
            info("[Wapiti] Loading model: \"%s\"\n", mdl->opt->model);
            FILE *file = fopen(mdl->opt->model, "r");
            if (file == NULL) {
                pfatal("cannot open input model file: %s", mdl->opt->model);
            }
            mdl_load(mdl, file);

            return mdl;
    }